

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  Layer *pLVar9;
  int iVar10;
  char cVar11;
  ParamDict pd;
  Mat local_78;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 2:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 3:
    pLVar9 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 4:
    pLVar9 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 5:
    pLVar9 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 6:
    pLVar9 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  default:
    pLVar9 = (Layer *)0x0;
    goto LAB_0043850b;
  }
  ParamDict::~ParamDict((ParamDict *)&local_78);
LAB_0043850b:
  if (pLVar9 != (Layer *)0x0) {
    (*pLVar9->_vptr_Layer[4])(pLVar9,opt);
  }
  this->activation = pLVar9;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar10 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  uVar8 = (this->super_ConvolutionDepthWise).num_output;
  _h = (this->super_ConvolutionDepthWise).group;
  uVar5 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)_h;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar10;
  if ((_h == uVar8) &&
     (uVar8 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                   (long)((int)uVar8 / (int)_h)) * _h, uVar8 == _h)) {
    cVar11 = '\x01';
    if (opt->use_packing_layout == true) {
      cVar11 = '\b';
      if ((uVar8 & 7) != 0) {
        cVar11 = ((uVar8 & 3) == 0) * '\x03' + '\x01';
      }
    }
    if (cVar11 != '\x01') {
      if (cVar11 == '\x04') {
        Mat::reshape(&local_78,&(this->super_ConvolutionDepthWise).weight_data,iVar10,
                     (this->super_ConvolutionDepthWise).group,(Allocator *)0x0);
        convert_packing(&local_78,&this->weight_data_tm,4,opt);
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (cVar11 == '\b') {
        Mat::reshape(&local_78,&(this->super_ConvolutionDepthWise).weight_data,iVar10,_h,
                     (Allocator *)0x0);
        convert_packing(&local_78,&this->weight_data_tm,8,opt);
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_004387de;
    }
    auVar6._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar6._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar6._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar6._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar6 = vpcmpeqd_avx(auVar6,_DAT_00610380);
    uVar8 = vmovmskps_avx(auVar6);
    iVar10 = (this->super_ConvolutionDepthWise).stride_w;
    iVar1 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar1 == 1 && (iVar10 == 1 && (uVar8 ^ 0xf) == 0)) ||
       ((iVar1 == 2 && iVar10 == 2) && (char)(uVar8 ^ 0xf) == '\0')) {
      piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar2;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar10 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar1 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar7 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar10;
      (this->weight_data_tm).h = iVar1;
      (this->weight_data_tm).d = iVar7;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_004387de;
    }
  }
  create_group_ops(this,opt);
LAB_004387de:
  if (opt->lightmode == true) {
    piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar4 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}